

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextengine.cpp
# Opt level: O1

void __thiscall QTextEngine::QTextEngine(QTextEngine *this)

{
  (this->lines).d.d = (Data *)0x0;
  (this->lines).d.ptr = (QScriptLine *)0x0;
  (this->lines).d.size = 0;
  FontEngineCache::FontEngineCache(&this->feCache);
  (this->text).d.size = 0;
  (this->text).d.d = (Data *)0x0;
  (this->text).d.ptr = (char16_t *)0x0;
  QFont::QFont(&this->fnt);
  QRawFont::QRawFont(&this->rawFont);
  (this->block).p = (QTextDocumentPrivate *)0x0;
  (this->block).n = 0;
  QTextOption::QTextOption(&this->option);
  this->minWidth = 0;
  this->maxWidth = 0;
  (this->position).xp = 0.0;
  (this->position).yp = 0.0;
  (this->underlineList).d.d = (Data *)0x0;
  (this->underlineList).d.ptr = (ItemDecoration *)0x0;
  (this->underlineList).d.size = 0;
  (this->strikeOutList).d.d = (Data *)0x0;
  (this->strikeOutList).d.ptr = (ItemDecoration *)0x0;
  (this->strikeOutList).d.size = 0;
  (this->overlineList).d.d = (Data *)0x0;
  (this->overlineList).d.ptr = (ItemDecoration *)0x0;
  (this->overlineList).d.size = 0;
  this->specialData = (SpecialData *)0x0;
  this->layoutData = (LayoutData *)0x0;
  this->minWidth = 0;
  this->maxWidth = 0;
  this->field_0xa8 = this->field_0xa8 & 0x80;
  return;
}

Assistant:

QTextEngine::QTextEngine()
{
    init(this);
}